

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O0

void __thiscall bwtil::WaveletTree::loadFromFile(WaveletTree *this,FILE *fp)

{
  FILE *in_RSI;
  void *in_RDI;
  ulint i;
  FILE *in_stack_00000068;
  ulint numBytes;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *__x;
  allocator_type *__a;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *this_00;
  undefined8 local_50;
  
  __x = (vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)0x8;
  __a = (allocator_type *)0x1;
  fread(in_RDI,8,1,in_RSI);
  fread((void *)((long)in_RDI + 0x20),4,(size_t)__a,in_RSI);
  fread((void *)((long)in_RDI + 0x24),4,(size_t)__a,in_RSI);
  fread((void *)((long)in_RDI + 0x28),(size_t)__x,(size_t)__a,in_RSI);
  this_00 = *(vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> **)
             ((long)in_RDI + 0x28);
  std::allocator<bwtil::succinct_bitvector>::allocator
            ((allocator<bwtil::succinct_bitvector> *)0x1705ff);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (this_00,(size_type)in_RDI,__a);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator=
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)__a,
             __x);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)__a);
  std::allocator<bwtil::succinct_bitvector>::~allocator
            ((allocator<bwtil::succinct_bitvector> *)0x17063c);
  for (local_50 = 0; local_50 < *(ulong *)((long)in_RDI + 0x28); local_50 = local_50 + 1) {
    std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::operator[]
              ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
               ((long)in_RDI + 8),local_50);
    succinct_bitvector::loadFromFile((succinct_bitvector *)numBytes,in_stack_00000068);
  }
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_nodes, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		nodes = vector<succinct_bitvector>(number_of_nodes);

		for(ulint i=0;i<number_of_nodes;i++)
			nodes[i].loadFromFile(fp);

		numBytes++;//avoids "variable not used" warning

	}